

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
CustomLayerParams_CustomLayerParamValue
          (CustomLayerParams_CustomLayerParamValue *this,
          CustomLayerParams_CustomLayerParamValue *from)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__CustomLayerParams_CustomLayerParamValue_003ff188;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  if (uVar1 == 10) {
    _internal_set_doublevalue(this,(from->value_).doublevalue_);
  }
  else if (uVar1 == 0x14) {
    uVar2 = (from->value_).longvalue_;
    clear_value(this);
    this->_oneof_case_[0] = 0x14;
    (this->value_).doublevalue_ =
         (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar4 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      puVar4 = (undefined8 *)*puVar4;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              ((ArenaStringPtr *)&this->value_,uVar2 & 0xfffffffffffffffe,puVar4);
  }
  else if (uVar1 == 0x1e) {
    _internal_set_intvalue(this,(from->value_).intvalue_);
  }
  else if (uVar1 == 0x28) {
    _internal_set_longvalue(this,(from->value_).longvalue_);
  }
  else if (uVar1 == 0x32) {
    _internal_set_boolvalue(this,(bool)((from->value_).boolvalue_ & 1));
  }
  return;
}

Assistant:

CustomLayerParams_CustomLayerParamValue::CustomLayerParams_CustomLayerParamValue(const CustomLayerParams_CustomLayerParamValue& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  clear_has_value();
  switch (from.value_case()) {
    case kDoubleValue: {
      _internal_set_doublevalue(from._internal_doublevalue());
      break;
    }
    case kStringValue: {
      _internal_set_stringvalue(from._internal_stringvalue());
      break;
    }
    case kIntValue: {
      _internal_set_intvalue(from._internal_intvalue());
      break;
    }
    case kLongValue: {
      _internal_set_longvalue(from._internal_longvalue());
      break;
    }
    case kBoolValue: {
      _internal_set_boolvalue(from._internal_boolvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CustomLayerParams.CustomLayerParamValue)
}